

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkfd_linux.c
# Opt level: O0

int system_vforkfd(int flags,pid_t *ppid,_func_int_void_ptr *childFn,void *token,int *system)

{
  undefined1 *puVar1;
  long in_FS_OFFSET;
  undefined1 auStack_100 [4];
  int local_fc;
  undefined1 *local_f8;
  undefined1 *local_f0;
  long local_e8;
  undefined1 *local_e0;
  undefined4 local_d8;
  int local_d4;
  undefined8 local_d0;
  int local_c4;
  long local_c0;
  undefined1 *local_b8;
  int *local_b0;
  void *local_a8;
  _func_int_void_ptr *local_a0;
  int *local_98;
  int local_8c;
  int local_88;
  undefined4 local_84 [9];
  long local_60;
  
  local_60 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0 = system;
  local_a8 = token;
  local_a0 = childFn;
  local_98 = ppid;
  local_8c = flags;
  local_e8 = sysconf(0xfa);
  puVar1 = (undefined1 *)
           ((ulong)(auStack_100 + -(local_e8 + 0xfU & 0xfffffffffffffff0)) & 0xffffffffffffffc0);
  if (local_e8 != 0) {
    local_f8 = puVar1 + local_e8;
    local_f0 = puVar1;
    do {
      *local_f0 = 0xaa;
      local_f0 = local_f0 + 1;
    } while (local_f0 != local_f8);
  }
  local_c4 = -0x55555556;
  local_84[0] = 0xaaaaaaaa;
  local_d0 = 0x5111;
  *(undefined8 *)(puVar1 + -8) = 0x7d97e2;
  local_e0 = puVar1;
  local_c0 = local_e8;
  local_b8 = auStack_100;
  local_d4 = system_forkfd_availability();
  if (local_d4 < 0) {
    *local_b0 = 0;
    local_88 = local_d4;
  }
  else {
    *local_b0 = 1;
    *(undefined8 *)(puVar1 + -0x10) = 0;
    *(undefined8 *)(puVar1 + -0x18) = 0x7d9846;
    local_c4 = clone((__fn *)local_a0,local_e0 + local_e8,(int)local_d0,local_a8,local_84,0);
    local_88 = local_c4;
    if (-1 < local_c4) {
      if (local_98 != (int *)0x0) {
        *local_98 = local_c4;
      }
      *(undefined8 *)(puVar1 + -8) = 0x7d987d;
      local_88 = system_forkfd_pidfd_set_flags(*(int *)(puVar1 + 0xc),*(int *)(puVar1 + 8));
    }
  }
  local_d8 = 1;
  local_fc = local_88;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_60) {
    *(undefined **)(local_b8 + -8) = &UNK_007d98b8;
    __stack_chk_fail();
  }
  return local_88;
}

Assistant:

int system_vforkfd(int flags, pid_t *ppid, int (*childFn)(void *), void *token, int *system)
{
    __attribute__((aligned(64))) char childStack[SIGSTKSZ];
    pid_t pid;
    int pidfd;
    unsigned long cloneflags = CLONE_PIDFD | CLONE_VFORK | CLONE_VM | SIGCHLD;

    int state = system_forkfd_availability();
    if (state < 0) {
        *system = 0;
        return state;
    }
    *system = 1;

    pid = clone(childFn, childStack + sizeof(childStack), cloneflags, token, &pidfd, NULL, NULL);
    if (pid < 0)
        return pid;
    if (ppid)
        *ppid = pid;
    return system_forkfd_pidfd_set_flags(pidfd, flags);
}